

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

void __thiscall fasttext::Model::computeOutputSoftmax(Model *this,Vector *hidden,Vector *output)

{
  undefined1 auVar1 [16];
  real *prVar2;
  long lVar3;
  double dVar4;
  undefined1 auVar5 [64];
  float fVar6;
  
  Vector::mul(output,(this->wo_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,hidden);
  prVar2 = Vector::operator[](output,0);
  if (0 < this->osz_) {
    auVar5 = ZEXT464((uint)*prVar2);
    lVar3 = 0;
    do {
      prVar2 = Vector::operator[](output,lVar3);
      auVar1 = vmaxss_avx(ZEXT416(auVar5._0_4_),ZEXT416((uint)*prVar2));
      auVar5 = ZEXT1664(auVar1);
      lVar3 = lVar3 + 1;
    } while (lVar3 < this->osz_);
    if (0 < this->osz_) {
      fVar6 = 0.0;
      lVar3 = 0;
      do {
        prVar2 = Vector::operator[](output,lVar3);
        dVar4 = exp((double)(*prVar2 - auVar1._0_4_));
        prVar2 = Vector::operator[](output,lVar3);
        *prVar2 = (float)dVar4;
        prVar2 = Vector::operator[](output,lVar3);
        fVar6 = fVar6 + *prVar2;
        lVar3 = lVar3 + 1;
      } while (lVar3 < this->osz_);
      if (0 < this->osz_) {
        lVar3 = 0;
        do {
          prVar2 = Vector::operator[](output,lVar3);
          *prVar2 = *prVar2 / fVar6;
          lVar3 = lVar3 + 1;
        } while (lVar3 < this->osz_);
      }
    }
  }
  return;
}

Assistant:

void Model::computeOutputSoftmax(Vector& hidden, Vector& output) const {
  output.mul(*wo_, hidden);
  real max = output[0], z = 0.0;
  for (int32_t i = 0; i < osz_; i++) {
    max = std::max(output[i], max);
  }
  for (int32_t i = 0; i < osz_; i++) {
    output[i] = exp(output[i] - max);
    z += output[i];
  }
  for (int32_t i = 0; i < osz_; i++) {
    output[i] /= z;
  }
}